

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

uint64_t filemgr_flush_immutable(filemgr *file,err_log_callback *log_callback)

{
  uint8_t uVar1;
  fdb_status fVar2;
  filemgr *file_00;
  fdb_status rv;
  uint64_t ret;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  fdb_status in_stack_0000020c;
  err_log_callback *in_stack_00000210;
  filemgr_ops *in_stack_00000218;
  undefined4 in_stack_ffffffffffffffd8;
  memory_order in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  if (global_config.ncacheblock < 1) {
    local_8 = 0;
  }
  else {
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)0x0,in_stack_ffffffffffffffdc);
    if (uVar1 == '\0') {
      file_00 = (filemgr *)
                bcache_get_num_immutable
                          ((filemgr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
      if (file_00 == (filemgr *)0x0) {
        local_8 = 0;
      }
      else {
        fVar2 = bcache_flush_immutable(file_00);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          _log_errno_str(in_stack_00000218,in_stack_00000210,in_stack_0000020c,in_stack_00000200,
                         in_stack_000001f8);
        }
        local_8 = bcache_get_num_immutable((filemgr *)CONCAT44(fVar2,in_stack_ffffffffffffffd8));
      }
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint64_t filemgr_flush_immutable(struct filemgr *file,
                                   err_log_callback *log_callback)
{
    uint64_t ret = 0;
    if (global_config.ncacheblock > 0) {
        if (atomic_get_uint8_t(&file->io_in_prog)) {
            return 0;
        }
        ret = bcache_get_num_immutable(file);
        if (!ret) {
            return ret;
        }
        fdb_status rv = bcache_flush_immutable(file);
        if (rv != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status)rv, "WRITE",
                           file->filename);
        }
        return bcache_get_num_immutable(file);
    }

    return ret;
}